

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void setResultStrOrError(sqlite3_context *pCtx,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  u8 desiredEnc;
  Mem *pMem;
  ushort uVar1;
  int iVar2;
  
  pMem = pCtx->pOut;
  iVar2 = sqlite3VdbeMemSetStr(pMem,z,(long)n,enc,xDel);
  if (iVar2 != 0) {
    if (iVar2 != 0x12) {
      sqlite3_result_error_nomem(pCtx);
      return;
    }
LAB_0011ce25:
    pCtx->isError = 0x12;
    sqlite3VdbeMemSetStr(pCtx->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
    return;
  }
  desiredEnc = pCtx->enc;
  uVar1 = pMem->flags;
  if ((uVar1 & 2) == 0) {
    pMem->enc = desiredEnc;
  }
  else if (pMem->enc != desiredEnc) {
    sqlite3VdbeMemTranslate(pMem,desiredEnc);
    uVar1 = pMem->flags;
  }
  if ((uVar1 & 0x12) != 0) {
    iVar2 = pMem->n;
    if ((uVar1 >> 10 & 1) != 0) {
      iVar2 = iVar2 + (pMem->u).nZero;
    }
    if (pMem->db->aLimit[0] < iVar2) goto LAB_0011ce25;
  }
  return;
}

Assistant:

static void setResultStrOrError(
  sqlite3_context *pCtx,  /* Function context */
  const char *z,          /* String pointer */
  int n,                  /* Bytes in string, or negative */
  u8 enc,                 /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*)     /* Destructor function */
){
  Mem *pOut = pCtx->pOut;
  int rc = sqlite3VdbeMemSetStr(pOut, z, n, enc, xDel);
  if( rc ){
    if( rc==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(pCtx);
    }else{
      /* The only errors possible from sqlite3VdbeMemSetStr are
      ** SQLITE_TOOBIG and SQLITE_NOMEM */
      assert( rc==SQLITE_NOMEM );
      sqlite3_result_error_nomem(pCtx);
    }
    return;
  }
  sqlite3VdbeChangeEncoding(pOut, pCtx->enc);
  if( sqlite3VdbeMemTooBig(pOut) ){
    sqlite3_result_error_toobig(pCtx);
  }
}